

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_rule.hpp
# Opt level: O0

error_code __thiscall
pstore::exchange::import_ns::rule::
replace_top<pstore::exchange::import_ns::strings_array_members,pstore::transaction<pstore::lock_guard<pstore::transaction_mutex>>*,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping*>>
          (rule *this,transaction<pstore::lock_guard<pstore::transaction_mutex>_> *args,
          not_null<pstore::exchange::import_ns::string_mapping_*> args_1)

{
  stack<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::deque<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>_>
  *this_00;
  error_code eVar1;
  unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
  local_58;
  context *local_50;
  context *context;
  unique_ptr<pstore::exchange::import_ns::strings_array_members,_std::default_delete<pstore::exchange::import_ns::strings_array_members>_>
  local_38;
  __single_object p;
  transaction<pstore::lock_guard<pstore::transaction_mutex>_> *args_local;
  rule *this_local;
  not_null<pstore::exchange::import_ns::string_mapping_*> args_local_1;
  error_category *local_10;
  
  p._M_t.
  super___uniq_ptr_impl<pstore::exchange::import_ns::strings_array_members,_std::default_delete<pstore::exchange::import_ns::strings_array_members>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::exchange::import_ns::strings_array_members_*,_std::default_delete<pstore::exchange::import_ns::strings_array_members>_>
  .super__Head_base<0UL,_pstore::exchange::import_ns::strings_array_members_*,_false>._M_head_impl =
       (__uniq_ptr_data<pstore::exchange::import_ns::strings_array_members,_std::default_delete<pstore::exchange::import_ns::strings_array_members>,_true,_true>
        )(__uniq_ptr_data<pstore::exchange::import_ns::strings_array_members,_std::default_delete<pstore::exchange::import_ns::strings_array_members>,_true,_true>
          )args;
  std::
  make_unique<pstore::exchange::import_ns::strings_array_members,pstore::gsl::not_null<pstore::exchange::import_ns::context*>const&,pstore::transaction<pstore::lock_guard<pstore::transaction_mutex>>*&,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping*>&>
            ((not_null<pstore::exchange::import_ns::context_*> *)&local_38,
             (transaction<pstore::lock_guard<pstore::transaction_mutex>_> **)&this->context_,
             (not_null<pstore::exchange::import_ns::string_mapping_*> *)&p);
  log_top(this,false);
  local_50 = get_context(this);
  std::
  stack<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::deque<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>_>
  ::pop(&local_50->stack);
  this_00 = &local_50->stack;
  std::
  unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>
  ::
  unique_ptr<pstore::exchange::import_ns::strings_array_members,std::default_delete<pstore::exchange::import_ns::strings_array_members>,void>
            ((unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>
              *)&local_58,&local_38);
  std::
  stack<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::deque<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>_>
  ::push(this_00,(value_type *)&local_58);
  std::
  unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
  ::~unique_ptr(&local_58);
  log_top(this,true);
  std::error_code::error_code((error_code *)&args_local_1);
  std::
  unique_ptr<pstore::exchange::import_ns::strings_array_members,_std::default_delete<pstore::exchange::import_ns::strings_array_members>_>
  ::~unique_ptr(&local_38);
  eVar1._4_4_ = 0;
  eVar1._M_value = (uint)args_local_1.ptr_;
  eVar1._M_cat = local_10;
  return eVar1;
}

Assistant:

std::error_code replace_top (Args... args) {
                    auto p = std::make_unique<T> (context_, args...);
                    this->log_top (false);
                    // Remember the context pointer before we destroy 'this'.
                    auto * const context = this->get_context ();
                    context->stack.pop (); // Destroys this object.
                    context->stack.push (std::move (p));
                    this->log_top (true);
                    return {};
                }